

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O1

void __thiscall cfd::js::api::json::BlindTxInRequest::~BlindTxInRequest(BlindTxInRequest *this)

{
  ~BlindTxInRequest(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~BlindTxInRequest() {
    // do nothing
  }